

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

int SaveBinary3dos(path *fname,aint start,aint length,byte type,word w2,word w3)

{
  pointer pcVar1;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar9 [16];
  byte p3dos_header [128];
  undefined8 local_b8;
  char acStack_b0 [10];
  undefined2 uStack_a6;
  word wStack_a4;
  undefined2 uStack_a2;
  undefined1 local_39;
  
  bVar7 = 0;
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_b8 = acStack_b0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",local_b8,FATAL);
    if (local_b8 != acStack_b0 + 8) {
      operator_delete(local_b8,CONCAT26(uStack_a2,
                                        CONCAT24(wStack_a4,
                                                 CONCAT13(uStack_a6._1_1_,
                                                          CONCAT12((undefined1)uStack_a6,
                                                                   CONCAT11(acStack_b0[9],
                                                                            acStack_b0[8]))))) + 1);
    }
  }
  puVar5 = &DAT_0016a240;
  puVar6 = &local_b8;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  iVar2 = length + 0x80;
  acStack_b0[3] = (char)iVar2;
  acStack_b0[4] = (char)((uint)iVar2 >> 8);
  acStack_b0[5] = (char)((uint)iVar2 >> 0x10);
  acStack_b0[6] = (char)((uint)iVar2 >> 0x18);
  acStack_b0[7] = type;
  acStack_b0[8] = (char)length;
  acStack_b0[9] = (char)((uint)length >> 8);
  uStack_a6 = w2;
  wStack_a4 = w3;
  cVar8 = '\0';
  cVar10 = '\0';
  cVar11 = '\0';
  cVar12 = '\0';
  cVar13 = '\0';
  cVar14 = '\0';
  cVar15 = '\0';
  cVar16 = '\0';
  cVar17 = '\0';
  cVar18 = '\0';
  cVar19 = '\0';
  cVar20 = '\0';
  cVar21 = '\0';
  cVar22 = '\0';
  cVar23 = '\0';
  cVar24 = '\0';
  lVar4 = 0;
  do {
    cVar8 = cVar8 + acStack_b0[lVar4 + -8];
    cVar10 = cVar10 + acStack_b0[lVar4 + -7];
    cVar11 = cVar11 + acStack_b0[lVar4 + -6];
    cVar12 = cVar12 + acStack_b0[lVar4 + -5];
    cVar13 = cVar13 + acStack_b0[lVar4 + -4];
    cVar14 = cVar14 + acStack_b0[lVar4 + -3];
    cVar15 = cVar15 + acStack_b0[lVar4 + -2];
    cVar16 = cVar16 + acStack_b0[lVar4 + -1];
    cVar17 = cVar17 + acStack_b0[lVar4];
    cVar18 = cVar18 + acStack_b0[lVar4 + 1];
    cVar19 = cVar19 + acStack_b0[lVar4 + 2];
    cVar20 = cVar20 + acStack_b0[lVar4 + 3];
    cVar21 = cVar21 + acStack_b0[lVar4 + 4];
    cVar22 = cVar22 + acStack_b0[lVar4 + 5];
    cVar23 = cVar23 + acStack_b0[lVar4 + 6];
    cVar24 = cVar24 + acStack_b0[lVar4 + 7];
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x80);
  auVar9[1] = cVar18 + cVar10;
  auVar9[0] = cVar17 + cVar8;
  auVar9[2] = cVar19 + cVar11;
  auVar9[3] = cVar20 + cVar12;
  auVar9[4] = cVar21 + cVar13;
  auVar9[5] = cVar22 + cVar14;
  auVar9[6] = cVar23 + cVar15;
  auVar9[7] = cVar24 + cVar16;
  auVar9[8] = cVar17 * '\x02';
  auVar9[9] = cVar18 * '\x02';
  auVar9[10] = cVar19 * '\x02';
  auVar9[0xb] = cVar20 * '\x02';
  auVar9[0xc] = cVar21 * '\x02';
  auVar9[0xd] = cVar22 * '\x02';
  auVar9[0xe] = cVar23 * '\x02';
  auVar9[0xf] = cVar24 * '\x02';
  auVar9 = psadbw((undefined1  [16])0x0,auVar9);
  local_39 = auVar9[0];
  sVar3 = fwrite(&local_b8,1,0x80,__s);
  iVar2 = 0;
  if ((int)sVar3 == 0x80) {
    iVar2 = SaveRAM((FILE *)__s,start,length);
  }
  fclose(__s);
  return iVar2;
}

Assistant:

int SaveBinary3dos(const std::filesystem::path & fname, aint start, aint length, byte type, word w2, word w3) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	// prepare +3DOS 128 byte header content
	constexpr aint hsize = 128;
	const aint full_length = hsize + length;
	byte sum = 0, p3dos_header[hsize] { "PLUS3DOS\032\001" };
	p3dos_header[11] = byte(full_length>>0);
	p3dos_header[12] = byte(full_length>>8);
	p3dos_header[13] = byte(full_length>>16);
	p3dos_header[14] = byte(full_length>>24);
	// +3 BASIC 8 byte header filled with "relevant values"
	p3dos_header[15+0] = type;
	p3dos_header[15+1] = byte(length>>0);
	p3dos_header[15+2] = byte(length>>8);
	p3dos_header[15+3] = byte(w2>>0);
	p3dos_header[15+4] = byte(w2>>8);
	p3dos_header[15+5] = byte(w3>>0);
	p3dos_header[15+6] = byte(w3>>8);
	// calculat checksum of the header
	for (const byte v : p3dos_header) sum += v;
	p3dos_header[hsize-1] = sum;
	// write header and data
	int result = (hsize == (aint) fwrite(p3dos_header, 1, hsize, ff)) ? SaveRAM(ff, start, length) : 0;
	fclose(ff);
	return result;
}